

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::SetActiveScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  TTDSetActiveJsRTContext UNRECOVERED_JUMPTABLE;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  Var pvVar2;
  void *pvVar3;
  ScriptContext *pSVar4;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)18>
                     (evt);
  pvVar2 = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
  if (pvVar2 == (Var)0x0) {
    pSVar4 = (ScriptContext *)0x0;
  }
  else {
    if (((ulong)pvVar2 >> 0x30 != 0) || (**(int **)((long)pvVar2 + 8) != 0x50)) {
      TTDAbort_unrecoverable_error("Something is not right here!");
    }
    pSVar4 = *(ScriptContext **)(*(long *)(*(int **)((long)pvVar2 + 8) + 2) + 0x490);
  }
  UNRECOVERED_JUMPTABLE = (executeContext->TTDExternalObjectFunctions).pfSetActiveJsRTContext;
  pvVar3 = ThreadContextTTD::GetRuntimeHandle(executeContext);
  (*UNRECOVERED_JUMPTABLE)(pvVar3,pSVar4);
  return;
}

Assistant:

void SetActiveScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::SetActiveScriptContextActionTag>(evt);
            Js::Var gvar = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTDAssert(gvar == nullptr || Js::VarIs<Js::GlobalObject>(gvar), "Something is not right here!");

            Js::GlobalObject* gobj = static_cast<Js::GlobalObject*>(gvar);
            Js::ScriptContext* newCtx = (gobj != nullptr) ? gobj->GetScriptContext() : nullptr;

            executeContext->TTDExternalObjectFunctions.pfSetActiveJsRTContext(executeContext->GetRuntimeHandle(), newCtx);
        }